

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram.c
# Opt level: O1

uint32_t Ngram_bow(Ngram model,uint32_t *gram_words,uint32_t gram_len)

{
  uint uVar1;
  LowGram_T *pLVar2;
  uint32_t uVar3;
  UniGram_T *pUVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  uint32_t *puVar14;
  UniGram_T *pUVar15;
  bool bVar16;
  int iVar13;
  
  pUVar15 = model->uni_gram + *gram_words;
  if (gram_len == 1) {
    puVar14 = &pUVar15->bow;
    goto LAB_00102f20;
  }
  uVar3 = 0;
  if (model->ngram_order <= gram_len) {
    return 0;
  }
  uVar8 = 0xffffffff;
  bVar16 = gram_len != 0;
  if (bVar16) {
    pUVar4 = model->uni_gram + (*gram_words + 1);
    uVar6 = (ulong)(gram_len - 2);
    uVar8 = 1;
    uVar11 = 0;
    do {
      uVar12 = pUVar15->next_arr_idx;
      pLVar2 = model->low_grams[uVar11];
      uVar5 = pUVar4->next_arr_idx - uVar12;
      iVar13 = -1;
      if (uVar5 != 0) {
        uVar1 = gram_words[uVar8];
        lVar7 = (ulong)uVar5 - 1;
        lVar10 = 0;
        do {
          uVar9 = (ulong)(lVar10 + lVar7) >> 1;
          uVar5 = pLVar2[uVar12 + uVar9].word;
          if (uVar5 == uVar1) {
            iVar13 = (int)uVar9;
            break;
          }
          if (uVar5 < uVar1 || uVar5 == uVar1) {
            lVar10 = uVar9 + 1;
          }
          else {
            lVar7 = uVar9 - 1;
          }
          iVar13 = -1;
        } while (lVar10 <= lVar7);
      }
      uVar12 = iVar13 + uVar12;
      if (uVar8 == gram_len - 1) {
        uVar8 = (ulong)uVar12;
        uVar3 = pLVar2[uVar8].bow;
        goto LAB_00103039;
      }
      if (uVar12 == 0xffffffff) goto LAB_0010302a;
      pUVar15 = (UniGram_T *)&pLVar2[uVar12].next_arr_idx;
      pUVar4 = (UniGram_T *)&pLVar2[(ulong)uVar12 + 1].next_arr_idx;
      uVar11 = uVar11 + 1;
      uVar8 = uVar8 + 1;
      bVar16 = uVar8 < gram_len;
    } while( true );
  }
  uVar6 = 0;
  goto LAB_00103039;
LAB_0010302a:
  uVar3 = 0xffffffff;
  uVar8 = 0xffffffff;
  uVar6 = uVar11;
LAB_00103039:
  if (bVar16) {
    return uVar3;
  }
  puVar14 = &model->low_grams[uVar6 & 0xffffffff][uVar8].bow;
LAB_00102f20:
  return *puVar14;
}

Assistant:

uint32_t Ngram_bow(const Ngram model, const uint32_t* gram_words, uint32_t gram_len){
    uint32_t cur_word_id = gram_words[0];
    uint32_t next_word_start = model->uni_gram[cur_word_id].next_arr_idx;
    uint32_t next_word_end = model->uni_gram[cur_word_id+1].next_arr_idx;
    if (gram_len == 1) {
        return model->uni_gram[cur_word_id].bow;
    }
    if (gram_len >= model->ngram_order) {
        return 0;
    }
    uint32_t next = -1;
    uint32_t ngram_idx = 0;
    for (uint32_t j = 1; j < gram_len;j++) {
        next = search_low_gram(gram_words[j], model->low_grams[ngram_idx] + next_word_start, next_word_end - next_word_start)+next_word_start; 
        if(j == gram_len -1){
           return model->low_grams[ngram_idx][next].bow;
        }
        if (next == -1) {
            return -1;
        }else{
            next_word_start = model->low_grams[ngram_idx][next].next_arr_idx;
            next_word_end = model->low_grams[ngram_idx][next+1].next_arr_idx;
        }
        ngram_idx+=1;
    }
    return model->low_grams[ngram_idx][next].bow;
}